

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O2

Maybe<unsigned_int> __thiscall kj::anon_unknown_0::tryFromHexDigit(anon_unknown_0 *this,char c)

{
  int iVar1;
  undefined7 in_register_00000031;
  
  iVar1 = (int)CONCAT71(in_register_00000031,c);
  if ((byte)(c - 0x30U) < 10) {
    iVar1 = iVar1 + -0x30;
  }
  else if ((byte)(c + 0x9fU) < 6) {
    iVar1 = iVar1 + -0x57;
  }
  else {
    if (5 < (byte)(c + 0xbfU)) {
      *this = (anon_unknown_0)0x0;
      return (Maybe<unsigned_int>)(NullableValue<unsigned_int>)this;
    }
    iVar1 = iVar1 + -0x37;
  }
  *this = (anon_unknown_0)0x1;
  *(int *)(this + 4) = iVar1;
  return (Maybe<unsigned_int>)(NullableValue<unsigned_int>)this;
}

Assistant:

static Maybe<uint> tryFromHexDigit(char c) {
  if ('0' <= c && c <= '9') {
    return c - '0';
  } else if ('a' <= c && c <= 'f') {
    return c - ('a' - 10);
  } else if ('A' <= c && c <= 'F') {
    return c - ('A' - 10);
  } else {
    return nullptr;
  }
}